

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall
ON_PerObjectMeshParameters::Read(ON_PerObjectMeshParameters *this,ON_BinaryArchive *binary_archive)

{
  ON_MeshParameters *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint tcode;
  int major_version;
  ON__INT64 value;
  int minor_version;
  uint local_40;
  int local_3c;
  ON__INT64 local_38;
  int local_2c;
  
  this_00 = &this->m_mp;
  memcpy(this_00,&ON_MeshParameters::FastRenderMesh,0xe0);
  if ((this->m_mp).m_bCustomSettings == false) {
    *(undefined4 *)((this->m_mp).m_geometry_settings_hash.m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_mp).m_geometry_settings_hash.m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_mp).m_geometry_settings_hash.m_digest + 8) = uVar1;
    (this->m_mp).m_bCustomSettings = true;
  }
  ON_MeshParameters::SetComputeCurvature(this_00,false);
  local_3c = 0;
  local_2c = 0;
  bVar2 = ON_BinaryArchive::BeginRead3dmChunk(binary_archive,0x40008000,&local_3c,&local_2c);
  if (!bVar2) {
    return false;
  }
  if (local_3c == 1) {
    local_40 = 0;
    local_38 = 0;
    bVar2 = ON_BinaryArchive::BeginRead3dmBigChunk(binary_archive,&local_40,&local_38);
    if (bVar2) {
      bVar2 = false;
      if ((local_40 == 0x40008000) && (bVar2 = false, 0 < local_38)) {
        bVar2 = ON_MeshParameters::Read(this_00,binary_archive);
      }
      bVar3 = ON_BinaryArchive::EndRead3dmChunk(binary_archive);
      bVar4 = bVar3 & bVar2;
      goto LAB_005191c2;
    }
  }
  bVar4 = 0;
LAB_005191c2:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(binary_archive);
  if (this_00->m_bCustomSettings == false) {
    *(undefined4 *)((this->m_mp).m_geometry_settings_hash.m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_mp).m_geometry_settings_hash.m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_mp).m_geometry_settings_hash.m_digest + 8) = uVar1;
    (this->m_mp).m_bCustomSettings = true;
  }
  ON_MeshParameters::SetComputeCurvature(this_00,false);
  return (bool)(bVar4 & bVar2);
}

Assistant:

bool ON_PerObjectMeshParameters::Read(ON_BinaryArchive& binary_archive)
{
  m_mp = ON_MeshParameters::FastRenderMesh;
  m_mp.SetCustomSettings(true);
  m_mp.SetComputeCurvature(false);

  int major_version = 0;
  int minor_version = 0;
  if ( !binary_archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version) )
    return false;
    
  bool rc = false;
  for(;;)
  {
    if ( 1 != major_version )
      break;

    unsigned int tcode(0);
    ON__INT64 value(0);
    if (!binary_archive.BeginRead3dmBigChunk(&tcode,&value))
      break;
    bool mprc = false;
    for(;;)
    {
      if (TCODE_ANONYMOUS_CHUNK != tcode )
        break;
      if (value <= 0)
        break;
      if (!m_mp.Read(binary_archive))
        break;
      mprc = true;
      break;
    }
    if (!binary_archive.EndRead3dmChunk())
      break;
    if (!mprc)
      break;

    rc = true;
    break;
  }

  if ( !binary_archive.EndRead3dmChunk() )
    rc = false;

  m_mp.SetCustomSettings(true);
  m_mp.SetComputeCurvature(false);

  return rc;
}